

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack27_32(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0x7ffffff;
  puVar1 = out + 1;
  *puVar1 = *in >> 0x1b;
  *puVar1 = (in[1] & 0x3fffff) << 5 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[1] >> 0x16;
  *puVar1 = (in[2] & 0x1ffff) << 10 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[2] >> 0x11;
  *puVar1 = (in[3] & 0xfff) << 0xf | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[3] >> 0xc;
  *puVar1 = (in[4] & 0x7f) << 0x14 | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[4] >> 7;
  puVar2 = in + 5;
  *puVar1 = (*puVar2 & 3) << 0x19 | *puVar1;
  out[6] = *puVar2 >> 2 & 0x7ffffff;
  puVar1 = out + 7;
  *puVar1 = *puVar2 >> 0x1d;
  *puVar1 = (in[6] & 0xffffff) << 3 | *puVar1;
  puVar1 = out + 8;
  *puVar1 = in[6] >> 0x18;
  *puVar1 = (in[7] & 0x7ffff) << 8 | *puVar1;
  puVar1 = out + 9;
  *puVar1 = in[7] >> 0x13;
  *puVar1 = (in[8] & 0x3fff) << 0xd | *puVar1;
  puVar1 = out + 10;
  *puVar1 = in[8] >> 0xe;
  *puVar1 = (in[9] & 0x1ff) << 0x12 | *puVar1;
  puVar1 = out + 0xb;
  *puVar1 = in[9] >> 9;
  puVar2 = in + 10;
  *puVar1 = (*puVar2 & 0xf) << 0x17 | *puVar1;
  out[0xc] = *puVar2 >> 4 & 0x7ffffff;
  puVar1 = out + 0xd;
  *puVar1 = *puVar2 >> 0x1f;
  *puVar1 = (in[0xb] & 0x3ffffff) << 1 | *puVar1;
  puVar1 = out + 0xe;
  *puVar1 = in[0xb] >> 0x1a;
  *puVar1 = (in[0xc] & 0x1fffff) << 6 | *puVar1;
  puVar1 = out + 0xf;
  *puVar1 = in[0xc] >> 0x15;
  *puVar1 = (in[0xd] & 0xffff) << 0xb | *puVar1;
  puVar1 = out + 0x10;
  *puVar1 = in[0xd] >> 0x10;
  *puVar1 = (in[0xe] & 0x7ff) << 0x10 | *puVar1;
  puVar1 = out + 0x11;
  *puVar1 = in[0xe] >> 0xb;
  *puVar1 = (in[0xf] & 0x3f) << 0x15 | *puVar1;
  puVar1 = out + 0x12;
  *puVar1 = in[0xf] >> 6;
  puVar2 = in + 0x10;
  *puVar1 = (*puVar2 & 1) << 0x1a | *puVar1;
  out[0x13] = *puVar2 >> 1 & 0x7ffffff;
  puVar1 = out + 0x14;
  *puVar1 = *puVar2 >> 0x1c;
  *puVar1 = (in[0x11] & 0x7fffff) << 4 | *puVar1;
  puVar1 = out + 0x15;
  *puVar1 = in[0x11] >> 0x17;
  *puVar1 = (in[0x12] & 0x3ffff) << 9 | *puVar1;
  puVar1 = out + 0x16;
  *puVar1 = in[0x12] >> 0x12;
  *puVar1 = (in[0x13] & 0x1fff) << 0xe | *puVar1;
  puVar1 = out + 0x17;
  *puVar1 = in[0x13] >> 0xd;
  *puVar1 = (in[0x14] & 0xff) << 0x13 | *puVar1;
  puVar1 = out + 0x18;
  *puVar1 = in[0x14] >> 8;
  puVar2 = in + 0x15;
  *puVar1 = (*puVar2 & 7) << 0x18 | *puVar1;
  out[0x19] = *puVar2 >> 3 & 0x7ffffff;
  puVar1 = out + 0x1a;
  *puVar1 = *puVar2 >> 0x1e;
  *puVar1 = (in[0x16] & 0x1ffffff) << 2 | *puVar1;
  puVar1 = out + 0x1b;
  *puVar1 = in[0x16] >> 0x19;
  *puVar1 = (in[0x17] & 0xfffff) << 7 | *puVar1;
  puVar1 = out + 0x1c;
  *puVar1 = in[0x17] >> 0x14;
  *puVar1 = (in[0x18] & 0x7fff) << 0xc | *puVar1;
  puVar1 = out + 0x1d;
  *puVar1 = in[0x18] >> 0xf;
  *puVar1 = (in[0x19] & 0x3ff) << 0x11 | *puVar1;
  puVar1 = out + 0x1e;
  *puVar1 = in[0x19] >> 10;
  *puVar1 = (in[0x1a] & 0x1f) << 0x16 | *puVar1;
  out[0x1f] = in[0x1a] >> 5;
  return in + 0x1b;
}

Assistant:

const uint32_t *__fastunpack27_32(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 27);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 22)) << (27 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 17)) << (27 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 12)) << (27 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 7)) << (27 - 7);
  out++;
  *out = ((*in) >> 7);
  ++in;
  *out |= ((*in) % (1U << 2)) << (27 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 27);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 24)) << (27 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 19)) << (27 - 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 14)) << (27 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 9)) << (27 - 9);
  out++;
  *out = ((*in) >> 9);
  ++in;
  *out |= ((*in) % (1U << 4)) << (27 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 27);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 26)) << (27 - 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 21)) << (27 - 21);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 16)) << (27 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 11)) << (27 - 11);
  out++;
  *out = ((*in) >> 11);
  ++in;
  *out |= ((*in) % (1U << 6)) << (27 - 6);
  out++;
  *out = ((*in) >> 6);
  ++in;
  *out |= ((*in) % (1U << 1)) << (27 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 27);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 23)) << (27 - 23);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 18)) << (27 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 13)) << (27 - 13);
  out++;
  *out = ((*in) >> 13);
  ++in;
  *out |= ((*in) % (1U << 8)) << (27 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 3)) << (27 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 27);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 25)) << (27 - 25);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 20)) << (27 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 15)) << (27 - 15);
  out++;
  *out = ((*in) >> 15);
  ++in;
  *out |= ((*in) % (1U << 10)) << (27 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  *out |= ((*in) % (1U << 5)) << (27 - 5);
  out++;
  *out = ((*in) >> 5);
  ++in;
  out++;

  return in;
}